

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O1

int ConnectSBG(SBG *pSBG,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  char local_138;
  char local_137;
  
  memset(pSBG->szCfgFilePath,0,0x100);
  sprintf(pSBG->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pSBG->szDevPath + 5,0,0xfb);
    builtin_strncpy(pSBG->szDevPath,"COM1",5);
    pSBG->BaudRate = 0x1c200;
    pSBG->timeout = 1000;
    pSBG->threadperiod = 0x32;
    pSBG->bSaveRawData = 1;
    pSBG->gpsaccuracythreshold = 10.0;
    pSBG->rollorientation = 0.0;
    pSBG->rollp1 = 0.0;
    pSBG->rollp2 = 0.0;
    pSBG->pitchorientation = 0.0;
    pSBG->pitchp1 = 0.0;
    pSBG->pitchp2 = 0.0;
    pSBG->yaworientation = 0.0;
    pSBG->yawp1 = 0.0;
    pSBG->yawp2 = 0.0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fb15;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fb15:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pSBG->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fb94;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fb94:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fc13;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fc13:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fc92;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fc92:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fd13;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fd13:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pSBG->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fd94;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fd94:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->gpsaccuracythreshold);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fe15;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fe15:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->rollorientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010fe96;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010fe96:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->rollp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010ff17;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010ff17:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->rollp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0010ff98;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0010ff98:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->pitchorientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00110019;
        }
      } while (pcVar2 != (char *)0x0);
LAB_00110019:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->pitchp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0011009a;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0011009a:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->pitchp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0011011b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0011011b:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->yaworientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0011019c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0011019c:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->yawp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0011021d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_0011021d:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pSBG->yawp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0011028d;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0011028d:
  if (pSBG->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pSBG->threadperiod = 0x32;
  }
  if (pSBG->gpsaccuracythreshold <= 0.0 && pSBG->gpsaccuracythreshold != 0.0) {
    puts("Invalid parameter : gpsaccuracythreshold.");
    pSBG->gpsaccuracythreshold = 10.0;
  }
  memset(&pSBG->LastSBGData,0,0x11b0);
  iVar1 = OpenRS232Port(&pSBG->RS232Port,pSBG->szDevPath);
  if (iVar1 == 0) {
    iVar1 = (pSBG->RS232Port).DevType;
    if (3 < iVar1 - 1U) {
      if ((iVar1 != 0) ||
         (iVar1 = SetOptionsComputerRS232Port
                            ((pSBG->RS232Port).hDev,pSBG->BaudRate,'\0',0,'\b','\x02',pSBG->timeout)
         , iVar1 != 0)) {
        puts("Unable to connect to a SBG.");
        CloseRS232Port(&pSBG->RS232Port);
        goto LAB_001102ff;
      }
      tcflush(*(int *)&(pSBG->RS232Port).hDev,2);
    }
    puts("SBG connected.");
    iVar1 = 0;
  }
  else {
    puts("Unable to connect to a SBG.");
LAB_001102ff:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int ConnectSBG(SBG* pSBG, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
#ifdef ENABLE_SBG_SDK_SUPPORT
	char address[256];
	int iport = 0, ilport = 0;
#ifndef DISABLE_SBG_TCP
	char port[256];
#endif // DISABLE_SBG_TCP
	char* ptr = NULL;
	char* ptr2 = NULL;
#endif //ENABLE_SBG_SDK_SUPPORT

	memset(pSBG->szCfgFilePath, 0, sizeof(pSBG->szCfgFilePath));
	sprintf(pSBG->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pSBG->szDevPath, 0, sizeof(pSBG->szDevPath));
		sprintf(pSBG->szDevPath, "COM1");
		pSBG->BaudRate = 115200;
		pSBG->timeout = 1000;
		pSBG->threadperiod = 50;
		pSBG->bSaveRawData = 1;
		pSBG->gpsaccuracythreshold = 10;
		pSBG->rollorientation = 0;
		pSBG->rollp1 = 0;
		pSBG->rollp2 = 0;
		pSBG->pitchorientation = 0;
		pSBG->pitchp1 = 0;
		pSBG->pitchp2 = 0;
		pSBG->yaworientation = 0;
		pSBG->yawp1 = 0;
		pSBG->yawp2 = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pSBG->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSBG->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->gpsaccuracythreshold) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->rollorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->rollp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->rollp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->pitchorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->pitchp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->pitchp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->yaworientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->yawp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSBG->yawp2) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pSBG->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pSBG->threadperiod = 50;
	}
	if (pSBG->gpsaccuracythreshold < 0)
	{
		printf("Invalid parameter : gpsaccuracythreshold.\n");
		pSBG->gpsaccuracythreshold = 10;
	}

	// Used to save raw data, should be handled specifically...
	//pSBG->pfSaveFile = NULL;

	memset(&pSBG->LastSBGData, 0, sizeof(SBGDATA));

#ifdef ENABLE_SBG_SDK_SUPPORT
	memset(address, 0, sizeof(address));

	// inet_addr() vs sbgIpAddr()...?

	// Try to determine whether it is a server TCP port (e.g. :4001), client IP address and TCP port (e.g. 127.0.0.1:4001), 
	// IP address and UDP ports (e.g. udp://127.0.0.1:4001:4002) or local RS232 port.
#ifndef DISABLE_SBG_TCP
	memset(port, 0, sizeof(port));

	ptr = strchr(pSBG->szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');
	if ((strlen(pSBG->szDevPath) >= 12)&&(strncmp(pSBG->szDevPath, "tcpsrv://", strlen("tcpsrv://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+9, ptr2-(pSBG->szDevPath+9));
		strcpy(port, ptr2+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, sbgIpAddr(0, 0, 0, 0), atoi(port), true, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((strlen(pSBG->szDevPath) >= 9)&&(strncmp(pSBG->szDevPath, "tcp://", strlen("tcp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+6, ptr2-(pSBG->szDevPath+6));
		strcpy(port, ptr2+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, inet_addr(address), atoi(port), false, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((strlen(pSBG->szDevPath) >= 9)&&(strncmp(pSBG->szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+6, ptr2-(pSBG->szDevPath+6));
		sscanf(ptr2, ":%d:%d", &iport, &ilport);
		if (sbgInterfaceUdpCreate(&pSBG->sbgInterface, inet_addr(address), iport, ilport) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((strlen(pSBG->szDevPath) >= 5)&&(strncmp(pSBG->szDevPath, "tcp:", strlen("tcp:")) == 0)&&(atoi(pSBG->szDevPath+4) > 0))
	{
		strcpy(port, pSBG->szDevPath+4);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, sbgIpAddr(0, 0, 0, 0), atoi(port), true, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((pSBG->szDevPath[0] == ':')&&(atoi(pSBG->szDevPath+1) > 0))
	{
		strcpy(port, pSBG->szDevPath+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, sbgIpAddr(0, 0, 0, 0), atoi(port), true, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else if ((ptr != NULL)&&(ptr[1] != 0))
	{
		memcpy(address, pSBG->szDevPath, ptr-pSBG->szDevPath);
		strcpy(port, ptr+1);
		if (sbgInterfaceTcpCreate(&pSBG->sbgInterface, inet_addr(address), atoi(port), false, false, 10000, true) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sbgInterfaceSerialCreate(&pSBG->sbgInterface, pSBG->szDevPath, pSBG->BaudRate) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
#else
	ptr = strchr(pSBG->szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');
	if ((strlen(pSBG->szDevPath) >= 9)&&(strncmp(pSBG->szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pSBG->szDevPath+6, ptr2-(pSBG->szDevPath+6));
		sscanf(ptr2, ":%d:%d", &iport, &ilport);
		if (sbgInterfaceUdpCreate(&pSBG->sbgInterface, inet_addr(address), iport, ilport) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sbgInterfaceSerialCreate(&pSBG->sbgInterface, pSBG->szDevPath, pSBG->BaudRate) != SBG_NO_ERROR)
		{
			printf("Unable to connect to a SBG : Unable to create the interface.\n");
			return EXIT_FAILURE;
		}
	} 	  
#endif // DISABLE_SBG_TCP

	mSleep(500); // Needed sometimes to allow non-blocking sockets to be ready...

	if (sbgEComInit(&pSBG->comHandle, &pSBG->sbgInterface) != SBG_NO_ERROR)
	{
		printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
#ifndef DISABLE_SBG_TCP
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_TCP_IP)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceTcpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library and wrong interface type.\n");
		}
#else
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : Unable to initialize the sbgECom library and wrong interface type.\n");
		}
#endif // DISABLE_SBG_TCP
		return EXIT_FAILURE;
	}

	if (sbgEComCmdGetInfo(&pSBG->comHandle, &pSBG->deviceInfo) != SBG_NO_ERROR)
	{
		printf("Unable to connect to a SBG : Unable to get device information.\n");
		sbgEComClose(&pSBG->comHandle);
#ifndef DISABLE_SBG_TCP
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_TCP_IP)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceTcpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : Unable to get device information and wrong interface type.\n");
		}
#else
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to get device information.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : Unable to get device information and wrong interface type.\n");
		}
#endif // DISABLE_SBG_TCP
		return EXIT_FAILURE;
	}

	if (sbgEComSetReceiveLogCallback(&pSBG->comHandle, OnLogReceivedSBG, (void*)pSBG) != SBG_NO_ERROR)
	{
		printf("Unable to connect to a SBG : Unable to set callback.\n");
		sbgEComClose(&pSBG->comHandle);
#ifndef DISABLE_SBG_TCP
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to set callback.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to set callback.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_TCP_IP)
		{
			printf("Unable to connect to a SBG : Unable to set callback.\n");
			sbgInterfaceTcpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : Unable to set callback and wrong interface type.\n");
		}
#else
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : Unable to set callback.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : Unable to set callback.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : Unable to set callback and wrong interface type.\n");
		}
#endif // DISABLE_SBG_TCP
		return EXIT_FAILURE;
	}

	if (InitCriticalSection(&pSBG->CallbackCS) != EXIT_SUCCESS)
	{
		sbgEComClose(&pSBG->comHandle);
#ifndef DISABLE_SBG_TCP
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_TCP_IP)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceTcpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed and wrong interface type.\n");
		}
#else
		if (pSBG->sbgInterface.type == SBG_IF_TYPE_SERIAL)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceSerialDestroy(&pSBG->sbgInterface);
		}
		else if (pSBG->sbgInterface.type == SBG_IF_TYPE_ETH_UDP)
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed.\n");
			sbgInterfaceUdpDestroy(&pSBG->sbgInterface);
		}
		else
		{
			printf("Unable to connect to a SBG : InitCriticalSection() failed and wrong interface type.\n");
		}
#endif // DISABLE_SBG_TCP
		return EXIT_FAILURE;
	}
#else
	if (OpenRS232Port(&pSBG->RS232Port, pSBG->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SBG.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pSBG->RS232Port, pSBG->BaudRate, NOPARITY, FALSE, 8, 
		TWOSTOPBITS, (UINT)pSBG->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SBG.\n");
		CloseRS232Port(&pSBG->RS232Port);
		return EXIT_FAILURE;
	}
#endif // ENABLE_SBG_SDK_SUPPORT

	printf("SBG connected.\n");

	return EXIT_SUCCESS;
}